

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::FactorAlternationImpl::Round3
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  Regexp *this;
  RegexpOp RVar1;
  CharClass *this_00;
  ostream *poVar2;
  int in_ESI;
  long in_RDI;
  Regexp *re;
  iterator it;
  CharClass *cc;
  Regexp *re_1;
  int j;
  CharClassBuilder ccb;
  Regexp *first_i;
  int i;
  Regexp *first;
  int start;
  CharClassBuilder *in_stack_fffffffffffffd40;
  ostream *in_stack_fffffffffffffd48;
  LogMessage *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  ParseFlags in_stack_fffffffffffffd5c;
  CharClassBuilder *in_stack_fffffffffffffd60;
  Rune in_stack_fffffffffffffd74;
  Rune in_stack_fffffffffffffd78;
  LogMessage *in_stack_fffffffffffffd80;
  LogMessage *in_stack_fffffffffffffd88;
  LogMessage *in_stack_fffffffffffffd90;
  string local_248 [152];
  Rune in_stack_fffffffffffffe50;
  Rune in_stack_fffffffffffffe54;
  CharClassBuilder *in_stack_fffffffffffffe58;
  LogMessage *local_a8;
  int local_7c;
  Regexp *local_38;
  int local_2c;
  Regexp *local_28;
  int local_1c;
  
  local_1c = 0;
  local_28 = (Regexp *)0x0;
  for (local_2c = 0; local_2c <= in_ESI; local_2c = local_2c + 1) {
    local_38 = (Regexp *)0x0;
    if ((((in_ESI <= local_2c) ||
         (local_38 = *(Regexp **)(in_RDI + (long)local_2c * 8), local_28 == (Regexp *)0x0)) ||
        ((RVar1 = Regexp::op(local_28), RVar1 != kRegexpLiteral &&
         (RVar1 = Regexp::op(local_28), RVar1 != kRegexpCharClass)))) ||
       ((RVar1 = Regexp::op(local_38), RVar1 != kRegexpLiteral &&
        (RVar1 = Regexp::op(local_38), RVar1 != kRegexpCharClass)))) {
      if ((local_2c != local_1c) && (local_2c != local_1c + 1)) {
        CharClassBuilder::CharClassBuilder(in_stack_fffffffffffffd40);
        for (local_7c = local_1c; local_7c < local_2c; local_7c = local_7c + 1) {
          this = *(Regexp **)(in_RDI + (long)local_7c * 8);
          RVar1 = Regexp::op(this);
          if (RVar1 == kRegexpCharClass) {
            this_00 = Regexp::cc(this);
            in_stack_fffffffffffffd90 = (LogMessage *)CharClass::begin(this_00);
            local_a8 = in_stack_fffffffffffffd90;
            while (in_stack_fffffffffffffd80 = local_a8,
                  in_stack_fffffffffffffd88 = (LogMessage *)CharClass::end(this_00),
                  in_stack_fffffffffffffd80 != in_stack_fffffffffffffd88) {
              CharClassBuilder::AddRange
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                         in_stack_fffffffffffffe50);
              local_a8 = (LogMessage *)&local_a8->str_;
            }
          }
          else {
            RVar1 = Regexp::op(this);
            if (RVar1 == kRegexpLiteral) {
              in_stack_fffffffffffffd78 = Regexp::rune(this);
              in_stack_fffffffffffffd74 = Regexp::rune(this);
              Regexp::parse_flags(this);
              CharClassBuilder::AddRangeFlags
                        ((CharClassBuilder *)in_stack_fffffffffffffd50,
                         (Rune)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                         (Rune)in_stack_fffffffffffffd48,
                         (ParseFlags)((ulong)in_stack_fffffffffffffd40 >> 0x20));
            }
            else {
              LogMessage::LogMessage
                        (in_stack_fffffffffffffd80,(char *)CONCAT44(RVar1,in_stack_fffffffffffffd78)
                         ,in_stack_fffffffffffffd74);
              poVar2 = LogMessage::stream((LogMessage *)(local_248 + 0x20));
              in_stack_fffffffffffffd60 =
                   (CharClassBuilder *)std::operator<<(poVar2,"RE2: unexpected op: ");
              in_stack_fffffffffffffd5c = Regexp::op(this);
              in_stack_fffffffffffffd50 =
                   (LogMessage *)
                   std::ostream::operator<<(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
              in_stack_fffffffffffffd48 = std::operator<<((ostream *)in_stack_fffffffffffffd50," ");
              Regexp::ToString_abi_cxx11_((Regexp *)in_stack_fffffffffffffd88);
              std::operator<<(in_stack_fffffffffffffd48,local_248);
              std::__cxx11::string::~string(local_248);
              LogMessage::~LogMessage(in_stack_fffffffffffffd50);
            }
          }
          Regexp::Decref((Regexp *)in_stack_fffffffffffffd90);
        }
        in_stack_fffffffffffffd40 =
             (CharClassBuilder *)CharClassBuilder::GetCharClass(in_stack_fffffffffffffd60);
        Regexp::NewCharClass((CharClass *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
        std::vector<re2::Splice,std::allocator<re2::Splice>>::
        emplace_back<re2::Regexp*&,re2::Regexp**,int>
                  ((vector<re2::Splice,_std::allocator<re2::Splice>_> *)in_stack_fffffffffffffd60,
                   (Regexp **)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                   (Regexp ***)in_stack_fffffffffffffd50,(int *)in_stack_fffffffffffffd48);
        CharClassBuilder::~CharClassBuilder((CharClassBuilder *)0x25599c);
      }
      if (local_2c < in_ESI) {
        local_1c = local_2c;
        local_28 = local_38;
      }
    }
  }
  return;
}

Assistant:

void FactorAlternationImpl::Round3(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 3: Merge runs of literals and/or character classes.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // are either literals (i.e. runes) or character classes.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = sub[i];
      if (first != NULL &&
          (first->op() == kRegexpLiteral ||
           first->op() == kRegexpCharClass) &&
          (first_i->op() == kRegexpLiteral ||
           first_i->op() == kRegexpCharClass))
        continue;
    }

    // Found end of a run of Literal/CharClass:
    // sub[start:i] all are either one or the other,
    // but sub[i] is not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      CharClassBuilder ccb;
      for (int j = start; j < i; j++) {
        Regexp* re = sub[j];
        if (re->op() == kRegexpCharClass) {
          CharClass* cc = re->cc();
          for (CharClass::iterator it = cc->begin(); it != cc->end(); ++it)
            ccb.AddRange(it->lo, it->hi);
        } else if (re->op() == kRegexpLiteral) {
          ccb.AddRangeFlags(re->rune(), re->rune(), re->parse_flags());
        } else {
          LOG(DFATAL) << "RE2: unexpected op: " << re->op() << " "
                      << re->ToString();
        }
        re->Decref();
      }
      Regexp* re = Regexp::NewCharClass(ccb.GetCharClass(), flags);
      splices->emplace_back(re, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}